

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

_Bool al_rebase_path(ALLEGRO_PATH *head,ALLEGRO_PATH *tail)

{
  _Bool _Var1;
  ALLEGRO_PATH *path;
  ALLEGRO_PATH *pAVar2;
  ALLEGRO_PATH *in_RSI;
  long in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  ALLEGRO_PATH *in_stack_ffffffffffffffc0;
  uint i_00;
  undefined4 local_1c;
  undefined1 local_1;
  
  _Var1 = path_is_absolute(in_stack_ffffffffffffffc0);
  if (_Var1) {
    local_1 = false;
  }
  else {
    al_get_path_drive((ALLEGRO_PATH *)0x17c7fc);
    al_set_path_drive(in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_1c = 0;
    while( true ) {
      path = (ALLEGRO_PATH *)(ulong)local_1c;
      pAVar2 = (ALLEGRO_PATH *)_al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
      if (pAVar2 <= path) break;
      pAVar2 = in_RSI;
      i_00 = local_1c;
      get_segment_cstr(in_RSI,in_stack_ffffffffffffffbc);
      al_insert_path_component(path,i_00,(char *)pAVar2);
      local_1c = local_1c + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool al_rebase_path(const ALLEGRO_PATH *head, ALLEGRO_PATH *tail)
{
   unsigned i;
   ASSERT(head);
   ASSERT(tail);

   /* Don't bother concating if the tail is an absolute path. */
   if (path_is_absolute(tail)) {
      return false;
   }

   al_set_path_drive(tail, al_get_path_drive(head));

   for (i = 0; i < _al_vector_size(&head->segments); i++) {
      al_insert_path_component(tail, i, get_segment_cstr(head, i));
   }

   return true;
}